

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrIncr.c
# Opt level: O3

int IPdr_ManSolveInt(Pdr_Man_t *p,int fCheckClauses,int fPushClauses)

{
  abctime *paVar1;
  Aig_Obj_t *pAVar2;
  Vec_Vec_t *pVVar3;
  void *pvVar4;
  long lVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Vec_Int_t *pVVar10;
  int *piVar11;
  Abc_Cex_t *pAVar12;
  Vec_Ptr_t *pVVar13;
  Aig_Man_t *pAVar14;
  Pdr_Par_t *pPVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  char *pcVar24;
  Pdr_Man_t *pPVar25;
  ulong uVar26;
  long lVar27;
  byte bVar28;
  uint uVar29;
  timespec ts;
  Pdr_Set_t *pCube;
  Aig_Man_t *local_40;
  uint local_38;
  int local_34;
  
  pCube = (Pdr_Set_t *)0x0;
  uVar21 = p->pAig->nTruePos;
  uVar20 = (ulong)uVar21;
  if (1 < uVar21) {
    uVar20 = 0;
    uVar21 = uVar21 - 1;
    do {
      uVar20 = (ulong)((int)uVar20 + 1);
      bVar6 = 9 < uVar21;
      uVar21 = uVar21 / 10;
    } while (bVar6);
  }
  iVar7 = clock_gettime(3,(timespec *)&ts);
  if (iVar7 < 0) {
    lVar17 = -1;
  }
  else {
    lVar17 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  pPVar15 = p->pPars;
  iVar7 = pPVar15->nTimeOut;
  if ((long)iVar7 == 0) {
    lVar18 = 0;
  }
  else {
    iVar8 = clock_gettime(3,(timespec *)&ts);
    if (iVar8 < 0) {
      lVar18 = -1;
    }
    else {
      lVar18 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    lVar18 = lVar18 + (long)iVar7 * 1000000;
    pPVar15 = p->pPars;
  }
  p->timeToStop = lVar18;
  if ((pPVar15->fSolveAll != 0) && (pAVar14 = p->pAig, 0 < pAVar14->nTruePos)) {
    lVar18 = 0;
    do {
      if (pAVar14->vCos->nSize <= lVar18) {
LAB_009125f3:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (*(ulong *)((long)pAVar14->vCos->pArray[lVar18] + 8) == ((ulong)pAVar14->pConst1 ^ 1)) {
        pPVar15 = p->pPars;
        if (pPVar15->vOutMap->nSize <= lVar18) {
LAB_009121d3:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        pPVar15->vOutMap->pArray[lVar18] = 1;
        pPVar15->nProveOuts = pPVar15->nProveOuts + 1;
        if (pPVar15->fUseBridge != 0) {
          Gia_ManToBridgeResult(_stdout,1,(Abc_Cex_t *)0x0,(int)lVar18);
          pAVar14 = p->pAig;
        }
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < pAVar14->nTruePos);
  }
  iVar8 = 3;
  iVar7 = clock_gettime(3,(timespec *)&ts);
  if (iVar7 < 0) {
    lVar18 = -1;
  }
  else {
    lVar18 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  pPVar15 = p->pPars;
  pPVar15->timeLastSolved = lVar18;
  uVar21 = p->vClauses->nSize;
  if (uVar21 == 0) {
    uVar22 = 0;
    Pdr_ManCreateSolver(p,0);
  }
  else {
    if (fCheckClauses != 0) {
      if (pPVar15->fVerbose != 0) {
        Abc_Print(iVar8,"IPDR: Checking the reloaded length-%d trace...",(ulong)uVar21);
      }
      pPVar25 = p;
      IPdr_ManCheckClauses(p);
      iVar8 = (int)pPVar25;
      pPVar15 = p->pPars;
      if (pPVar15->fVerbose != 0) {
        Abc_Print(iVar8," Passed!\n");
        pPVar15 = p->pPars;
      }
    }
    uVar29 = uVar21 - 1;
    uVar22 = (ulong)uVar29;
    if (fPushClauses != 0) {
      uVar16 = 1;
      if (1 < (int)uVar29) {
        uVar16 = uVar29;
      }
      p->iUseFrame = uVar16;
      if (pPVar15->fVerbose != 0) {
        Abc_Print(iVar8,"IPDR: Pushing the reloaded clauses. Before:\n");
        iVar7 = clock_gettime(3,(timespec *)&ts);
        if (iVar7 < 0) {
          lVar18 = -1;
        }
        else {
          lVar18 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
        }
        Pdr_ManPrintProgress(p,1,lVar18 - lVar17);
      }
      pPVar25 = p;
      iVar7 = Pdr_ManPushClauses(p);
      if (p->pPars->fVerbose != 0) {
        Abc_Print((int)pPVar25,"IPDR: Finished pushing. After:\n");
        iVar8 = clock_gettime(3,(timespec *)&ts);
        if (iVar8 < 0) {
          lVar18 = -1;
        }
        else {
          lVar18 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
        }
        Pdr_ManPrintProgress(p,1,lVar18 - lVar17);
      }
      if (iVar7 != 0) {
        Pdr_ManReportInvariant(p);
        Pdr_ManVerifyInvariant(p);
        return 1;
      }
      pPVar15 = p->pPars;
    }
    if (((pPVar15->fUseAbs != 0) && (1 < (int)uVar21)) && (p->vAbsFlops == (Vec_Int_t *)0x0)) {
      local_40 = p->pAig;
      iVar7 = local_40->nRegs;
      pVVar10 = (Vec_Int_t *)malloc(0x10);
      uVar21 = iVar7 - 1;
      iVar8 = 0x10;
      if (0xe < uVar21) {
        iVar8 = iVar7;
      }
      pVVar10->nCap = iVar8;
      if (iVar8 == 0) {
        pVVar10->pArray = (int *)0x0;
        pVVar10->nSize = iVar7;
      }
      else {
        piVar11 = (int *)malloc((long)iVar8 << 2);
        pVVar10->pArray = piVar11;
        pVVar10->nSize = iVar7;
        if (piVar11 != (int *)0x0) {
          memset(piVar11,0,(long)iVar7 << 2);
          iVar7 = local_40->nRegs;
          uVar21 = iVar7 - 1;
        }
      }
      p->vAbsFlops = pVVar10;
      pVVar10 = (Vec_Int_t *)malloc(0x10);
      iVar8 = 0x10;
      if (0xe < uVar21) {
        iVar8 = iVar7;
      }
      pVVar10->nCap = iVar8;
      if (iVar8 == 0) {
        pVVar10->pArray = (int *)0x0;
        pVVar10->nSize = iVar7;
      }
      else {
        piVar11 = (int *)malloc((long)iVar8 << 2);
        pVVar10->pArray = piVar11;
        pVVar10->nSize = iVar7;
        if (piVar11 != (int *)0x0) {
          memset(piVar11,0xff,(long)iVar7 << 2);
        }
      }
      p->vMapFf2Ppi = pVVar10;
      pVVar10 = (Vec_Int_t *)malloc(0x10);
      pVVar10->nCap = 100;
      pVVar10->nSize = 0;
      piVar11 = (int *)malloc(400);
      pVVar10->pArray = piVar11;
      p->vMapPpi2Ff = pVVar10;
      IPdr_ManRestoreAbsFlops(p);
    }
  }
  local_40 = (Aig_Man_t *)0x0;
LAB_00911112:
  local_34 = 1;
  if (1 < (int)uVar22) {
    local_34 = (int)uVar22;
  }
LAB_00911121:
  if (((p->pPars->fUseAbs != 0) && (p->vAbsFlops == (Vec_Int_t *)0x0)) && ((uint)uVar22 == 1)) {
    pAVar14 = p->pAig;
    iVar7 = pAVar14->nRegs;
    local_38 = (uint)uVar22;
    pVVar10 = (Vec_Int_t *)malloc(0x10);
    uVar21 = iVar7 - 1;
    iVar8 = iVar7;
    if (uVar21 < 0xf) {
      iVar8 = 0x10;
    }
    pVVar10->nCap = iVar8;
    if (iVar8 == 0) {
      pVVar10->pArray = (int *)0x0;
      pVVar10->nSize = iVar7;
    }
    else {
      piVar11 = (int *)malloc((long)iVar8 << 2);
      pVVar10->pArray = piVar11;
      pVVar10->nSize = iVar7;
      if (piVar11 != (int *)0x0) {
        memset(piVar11,0,(long)iVar7 << 2);
        iVar7 = pAVar14->nRegs;
        uVar21 = iVar7 - 1;
      }
    }
    p->vAbsFlops = pVVar10;
    pVVar10 = (Vec_Int_t *)malloc(0x10);
    iVar8 = iVar7;
    if (uVar21 < 0xf) {
      iVar8 = 0x10;
    }
    pVVar10->nCap = iVar8;
    uVar22 = (ulong)local_38;
    if (iVar8 == 0) {
      pVVar10->pArray = (int *)0x0;
      pVVar10->nSize = iVar7;
    }
    else {
      piVar11 = (int *)malloc((long)iVar8 << 2);
      pVVar10->pArray = piVar11;
      pVVar10->nSize = iVar7;
      if (piVar11 != (int *)0x0) {
        memset(piVar11,0xff,(long)iVar7 << 2);
      }
    }
    p->vMapFf2Ppi = pVVar10;
    pVVar10 = (Vec_Int_t *)malloc(0x10);
    pVVar10->nCap = 100;
    pVVar10->nSize = 0;
    piVar11 = (int *)malloc(400);
    pVVar10->pArray = piVar11;
    p->vMapPpi2Ff = pVVar10;
  }
  uVar21 = (uint)uVar22;
  p->nFrames = uVar21;
  if (uVar21 != p->vSolvers->nSize - 1U) {
    __assert_fail("iFrame == Vec_PtrSize(p->vSolvers)-1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                  ,0x1d1,"int IPdr_ManSolveInt(Pdr_Man_t *, int, int)");
  }
  p->iUseFrame = local_34;
  p->iOutCur = 0;
  pAVar14 = p->pAig;
  iVar7 = pAVar14->nTruePos;
  uVar26 = 0;
  if (0 < iVar7) {
LAB_00911290:
    iVar8 = (int)uVar26;
    if ((iVar8 < 0) || (pAVar14->vCos->nSize <= iVar8)) goto LAB_009125f3;
    pVVar13 = p->vCexes;
    if (pVVar13 == (Vec_Ptr_t *)0x0) {
LAB_009112d4:
      paVar1 = p->pTime4Outs;
      if ((paVar1 == (abctime *)0x0) || (paVar1[uVar26] != 0)) {
        pAVar2 = *(Aig_Obj_t **)((long)pAVar14->vCos->pArray[uVar26] + 8);
        if (pAVar2 != (Aig_Obj_t *)((ulong)pAVar14->pConst1 ^ 1)) {
          if (pAVar2 != pAVar14->pConst1) {
            if (paVar1 != (abctime *)0x0) {
              if (paVar1[uVar26] < 1) {
                __assert_fail("p->pTime4Outs[p->iOutCur] > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                              ,0x202,"int IPdr_ManSolveInt(Pdr_Man_t *, int, int)");
              }
              iVar7 = clock_gettime(3,(timespec *)&ts);
              lVar18 = -1;
              local_40 = (Aig_Man_t *)0xffffffffffffffff;
              if (-1 < iVar7) {
                local_40 = (Aig_Man_t *)(ts.tv_nsec / 1000 + ts.tv_sec * 1000000);
              }
              lVar19 = p->pTime4Outs[p->iOutCur];
              iVar7 = clock_gettime(3,(timespec *)&ts);
              if (-1 < iVar7) {
                lVar18 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
              }
              p->timeToStopOne = lVar18 + lVar19;
            }
            do {
              while( true ) {
                pPVar15 = p->pPars;
                if ((pPVar15->nTimeOutGap != 0) && (pPVar15->timeLastSolved != 0)) {
                  iVar7 = 3;
                  iVar8 = clock_gettime(3,(timespec *)&ts);
                  if (iVar8 < 0) {
                    lVar18 = -1;
                  }
                  else {
                    lVar18 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                  }
                  pPVar15 = p->pPars;
                  if ((long)pPVar15->nTimeOutGap * 1000000 + pPVar15->timeLastSolved < lVar18)
                  goto LAB_00911ff6;
                }
                pPVar25 = p;
                iVar8 = Pdr_ManCheckCube(p,uVar21,(Pdr_Set_t *)0x0,&pCube,pPVar15->nConfLimit,0,1);
                iVar7 = (int)pPVar25;
                if (iVar8 != 0) break;
                pPVar25 = p;
                iVar9 = Pdr_ManBlockCube(p,pCube);
                iVar7 = (int)pPVar25;
                pPVar15 = p->pPars;
                iVar8 = pPVar15->fVerbose;
                if (iVar9 == 0) {
                  if ((iVar8 != 0) && (pPVar15->fUseAbs == 0)) {
                    iVar7 = pPVar15->fSolveAll;
                    iVar8 = clock_gettime(3,(timespec *)&ts);
                    if (iVar8 < 0) {
                      lVar18 = -1;
                    }
                    else {
                      lVar18 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                    }
                    Pdr_ManPrintProgress(p,(uint)(iVar7 == 0),lVar18 - lVar17);
                    pPVar15 = p->pPars;
                  }
                  pPVar15->iFrame = uVar21;
                  if (pPVar15->fSolveAll == 0) {
                    iVar7 = clock_gettime(3,(timespec *)&ts);
                    if (iVar7 < 0) {
                      lVar18 = 1;
                    }
                    else {
                      lVar18 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
                      lVar18 = ((lVar18 >> 7) - (lVar18 >> 0x3f)) + ts.tv_sec * -1000000;
                    }
                    pAVar12 = Pdr_ManDeriveCexAbs(p);
                    iVar7 = clock_gettime(3,(timespec *)&ts);
                    if (iVar7 < 0) {
                      lVar19 = -1;
                    }
                    else {
                      lVar19 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                    }
                    p->tAbs = p->tAbs + lVar19 + lVar18;
                    if (pAVar12 != (Abc_Cex_t *)0x0) {
                      p->pAig->pSeqModel = pAVar12;
                      pPVar15 = p->pPars;
                      if (pPVar15->fVerbose == 0) {
                        return 0;
                      }
                      if (pPVar15->fUseAbs != 0) {
                        iVar7 = pPVar15->fSolveAll;
                        iVar8 = clock_gettime(3,(timespec *)&ts);
                        if (iVar8 < 0) {
                          lVar18 = -1;
                        }
                        else {
                          lVar18 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                        }
                        Pdr_ManPrintProgress(p,(uint)(iVar7 == 0),lVar18 - lVar17);
                        return 0;
                      }
                      return 0;
                    }
                    if (p->pPars->fUseAbs == 0) {
                      __assert_fail("p->pPars->fUseAbs",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                                    ,0x252,"int IPdr_ManSolveInt(Pdr_Man_t *, int, int)");
                    }
                    Pdr_QueueClean(p);
                    pCube = (Pdr_Set_t *)0x0;
                    uVar26 = 1;
                    goto LAB_00911baa;
                  }
                  pPVar15->nFailOuts = pPVar15->nFailOuts + 1;
                  if ((pPVar15->fUseBridge == 0) && (pPVar15->fStoreCex == 0)) {
                    pAVar12 = (Abc_Cex_t *)0x1;
                  }
                  else {
                    pAVar12 = Pdr_ManDeriveCex(p);
                    pPVar15 = p->pPars;
                  }
                  pVVar10 = pPVar15->vOutMap;
                  if (pVVar10 != (Vec_Int_t *)0x0) {
                    iVar7 = p->iOutCur;
                    if (((long)iVar7 < 0) || (pVVar10->nSize <= iVar7)) goto LAB_009121d3;
                    pVVar10->pArray[iVar7] = 0;
                  }
                  uVar26 = (ulong)p->iOutCur;
                  if (((long)uVar26 < 0) || (pVVar13 = p->vCexes, pVVar13->nSize <= p->iOutCur))
                  goto LAB_009125f3;
                  if (pVVar13->pArray[uVar26] != (void *)0x0) {
                    __assert_fail("Vec_PtrEntry(p->vCexes, p->iOutCur) == NULL",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                                  ,0x261,"int IPdr_ManSolveInt(Pdr_Man_t *, int, int)");
                  }
                  if (pPVar15->fUseBridge != 0) {
                    Gia_ManToBridgeResult(_stdout,0,pAVar12,pAVar12->iPo);
                    uVar26 = (ulong)(uint)p->iOutCur;
                    if (p->iOutCur < 0) goto LAB_00912612;
                    pVVar13 = p->vCexes;
                  }
                  iVar7 = (int)uVar26;
                  if (pVVar13->nSize <= iVar7) goto LAB_00912612;
                  pVVar13->pArray[uVar26 & 0xffffffff] = pAVar12;
                  pPVar15 = p->pPars;
                  if (pPVar15->pFuncOnFail != (_func_int_int_Abc_Cex_t_ptr *)0x0) {
                    if (pPVar15->fStoreCex == 0) {
                      pAVar12 = (Abc_Cex_t *)0x0;
                    }
                    else {
                      if (p->vCexes->nSize <= iVar7) goto LAB_009125f3;
                      pAVar12 = (Abc_Cex_t *)p->vCexes->pArray[uVar26 & 0xffffffff];
                    }
                    iVar8 = (*pPVar15->pFuncOnFail)(iVar7,pAVar12);
                    pPVar15 = p->pPars;
                    if (iVar8 != 0) {
                      if (pPVar15->fVerbose != 0) {
                        iVar7 = clock_gettime(3,(timespec *)&ts);
                        if (iVar7 < 0) {
                          lVar18 = -1;
                        }
                        else {
                          lVar18 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                        }
                        pPVar25 = p;
                        Pdr_ManPrintProgress(p,1,lVar18 - lVar17);
                        iVar7 = (int)pPVar25;
                        pPVar15 = p->pPars;
                      }
                      if (pPVar15->fSilent == 0) {
                        Abc_Print(iVar7,"Quitting due to callback on fail in frame %d.\n",uVar22);
                        pPVar15 = p->pPars;
                      }
                      pPVar15->iFrame = uVar21;
                      return -1;
                    }
                  }
                  if (pPVar15->fNotVerbose == 0) {
                    Abc_Print(pPVar15->nFailOuts,
                              "Output %*d was asserted in frame %2d (%2d) (solved %*d out of %*d outputs).\n"
                              ,uVar20,(ulong)(uint)p->iOutCur,uVar22,uVar22,uVar20,
                              (ulong)(uint)pPVar15->nFailOuts,uVar20,(ulong)(uint)p->pAig->nTruePos)
                    ;
                    pPVar15 = p->pPars;
                  }
                  if (pPVar15->nFailOuts == p->pAig->nTruePos) {
                    return 0;
                  }
                  goto LAB_00911a7a;
                }
                if (iVar9 == -1) goto joined_r0x0091166a;
                if (iVar8 != 0) {
                  iVar7 = clock_gettime(3,(timespec *)&ts);
                  if (iVar7 < 0) {
                    lVar18 = -1;
                  }
                  else {
                    lVar18 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                  }
                  Pdr_ManPrintProgress(p,0,lVar18 - lVar17);
                }
              }
              if (iVar8 == 1) goto LAB_00911a8b;
            } while (iVar8 != -1);
            iVar8 = p->pPars->fVerbose;
joined_r0x0091166a:
            if (iVar8 != 0) {
              iVar7 = clock_gettime(3,(timespec *)&ts);
              if (iVar7 < 0) {
                lVar18 = -1;
              }
              else {
                lVar18 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
              }
              pPVar25 = p;
              Pdr_ManPrintProgress(p,1,lVar18 - lVar17);
              iVar7 = (int)pPVar25;
            }
            if (p->timeToStop == 0) {
              pPVar15 = p->pPars;
            }
            else {
              iVar7 = 3;
              iVar8 = clock_gettime(3,(timespec *)&ts);
              if (iVar8 < 0) {
                lVar18 = -1;
              }
              else {
                lVar18 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
              }
              pPVar15 = p->pPars;
              if (p->timeToStop < lVar18) goto LAB_009125b6;
            }
            if ((pPVar15->nTimeOutGap != 0) && (pPVar15->timeLastSolved != 0)) {
              iVar7 = 3;
              iVar8 = clock_gettime(3,(timespec *)&ts);
              if (iVar8 < 0) {
                lVar18 = -1;
              }
              else {
                lVar18 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
              }
              pPVar15 = p->pPars;
              if ((long)pPVar15->nTimeOutGap * 1000000 + pPVar15->timeLastSolved < lVar18) {
                pcVar24 = "Reached gap timeout (%d seconds) in frame %d.\n";
                uVar20 = (ulong)(uint)pPVar15->nTimeOutGap;
                goto LAB_00912064;
              }
            }
            if (p->timeToStopOne != 0) {
              iVar7 = 3;
              iVar8 = clock_gettime(3,(timespec *)&ts);
              if (iVar8 < 0) {
                lVar18 = -1;
              }
              else {
                lVar18 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
              }
              if (p->timeToStopOne < lVar18) {
LAB_00911a7a:
                Pdr_QueueClean(p);
                pCube = (Pdr_Set_t *)0x0;
LAB_00911a8b:
                if (p->pTime4Outs == (abctime *)0x0) goto LAB_00911b7f;
                iVar8 = 3;
                iVar7 = clock_gettime(3,(timespec *)&ts);
                if (iVar7 < 0) {
                  lVar18 = -1;
                }
                else {
                  lVar18 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                }
                iVar7 = p->iOutCur;
                lVar19 = p->pTime4Outs[iVar7];
                if (lVar19 < 1) {
                  __assert_fail("p->pTime4Outs[p->iOutCur] > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                                ,0x280,"int IPdr_ManSolveInt(Pdr_Man_t *, int, int)");
                }
                lVar23 = lVar19 - (lVar18 - (long)local_40);
                if (lVar23 == 0 || lVar19 < lVar18 - (long)local_40) {
                  lVar23 = 0;
                }
                p->pTime4Outs[iVar7] = lVar23;
                if (lVar23 == 0) {
                  if ((iVar7 < 0) || (p->vCexes->nSize <= iVar7)) goto LAB_009125f3;
                  if (p->vCexes->pArray[iVar7] == (void *)0x0) {
                    pPVar15 = p->pPars;
                    pPVar15->nDropOuts = pPVar15->nDropOuts + 1;
                    pVVar10 = pPVar15->vOutMap;
                    if (pVVar10 != (Vec_Int_t *)0x0) {
                      if (pVVar10->nSize <= iVar7) goto LAB_009121d3;
                      pVVar10->pArray[iVar7] = -1;
                    }
                    if (pPVar15->fNotVerbose == 0) {
                      Abc_Print(iVar8,"Timing out on output %*d in frame %d.\n",uVar20);
                    }
                  }
                }
                p->timeToStopOne = 0;
                goto LAB_00911b7f;
              }
              pPVar15 = p->pPars;
            }
            uVar20 = (ulong)(uint)pPVar15->nConfLimit;
            if (pPVar15->nConfLimit != 0) {
              pcVar24 = "Reached conflict limit (%d) in frame %d.\n";
              goto LAB_00912064;
            }
            if (pPVar15->fVerbose == 0) goto LAB_0091206d;
            pcVar24 = "Computation cancelled by the callback in frame %d.\n";
            goto LAB_0091212c;
          }
          pPVar15 = p->pPars;
          if (pPVar15->fSolveAll == 0) {
            pAVar12 = Abc_CexMakeTriv(pAVar14->nRegs,pAVar14->nTruePis,iVar7,uVar21 * iVar7 + iVar8)
            ;
            p->pAig->pSeqModel = pAVar12;
            return 0;
          }
          if ((pPVar15->fUseBridge == 0) && (pPVar15->fStoreCex == 0)) {
            pAVar12 = (Abc_Cex_t *)0x1;
          }
          else {
            pAVar12 = Abc_CexMakeTriv(pAVar14->nRegs,pAVar14->nTruePis,iVar7,iVar7 * uVar21 + iVar8)
            ;
            pPVar15 = p->pPars;
            uVar26 = (ulong)(uint)p->iOutCur;
          }
          pPVar15->nFailOuts = pPVar15->nFailOuts + 1;
          pVVar10 = pPVar15->vOutMap;
          if (pVVar10 != (Vec_Int_t *)0x0) {
            if (((int)uVar26 < 0) || (pVVar10->nSize <= (int)uVar26)) goto LAB_009121d3;
            pVVar10->pArray[uVar26] = 0;
            uVar26 = (ulong)(uint)p->iOutCur;
          }
          if (pPVar15->fNotVerbose == 0) {
            Abc_Print(pPVar15->nFailOuts,
                      "Output %*d was trivially asserted in frame %2d (solved %*d out of %*d outputs).\n"
                      ,uVar20,uVar26,uVar22,uVar20,(ulong)(uint)pPVar15->nFailOuts,uVar20,
                      (ulong)(uint)p->pAig->nTruePos);
            uVar26 = (ulong)(uint)p->iOutCur;
          }
          uVar29 = (uint)uVar26;
          if (((int)uVar29 < 0) || (pVVar13 = p->vCexes, pVVar13->nSize <= (int)uVar29))
          goto LAB_009125f3;
          if (pVVar13->pArray[uVar26] != (void *)0x0) {
            __assert_fail("Vec_PtrEntry(p->vCexes, p->iOutCur) == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                          ,0x1ed,"int IPdr_ManSolveInt(Pdr_Man_t *, int, int)");
          }
          if (p->pPars->fUseBridge != 0) {
            Gia_ManToBridgeResult(_stdout,0,pAVar12,pAVar12->iPo);
            uVar29 = p->iOutCur;
            if ((int)uVar29 < 0) goto LAB_00912612;
            pVVar13 = p->vCexes;
          }
          if (pVVar13->nSize <= (int)uVar29) {
LAB_00912612:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
          }
          pVVar13->pArray[uVar29] = pAVar12;
          pPVar15 = p->pPars;
          if (pPVar15->pFuncOnFail != (_func_int_int_Abc_Cex_t_ptr *)0x0) {
            if (pPVar15->fStoreCex == 0) {
              pAVar12 = (Abc_Cex_t *)0x0;
            }
            else {
              if (p->vCexes->nSize <= (int)uVar29) goto LAB_009125f3;
              pAVar12 = (Abc_Cex_t *)p->vCexes->pArray[uVar29];
            }
            iVar7 = (*pPVar15->pFuncOnFail)(uVar29,pAVar12);
            pPVar15 = p->pPars;
            if (iVar7 != 0) {
              if (pPVar15->fVerbose != 0) {
                iVar7 = clock_gettime(3,(timespec *)&ts);
                if (iVar7 < 0) {
                  lVar18 = -1;
                }
                else {
                  lVar18 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                }
                pPVar25 = p;
                Pdr_ManPrintProgress(p,1,lVar18 - lVar17);
                uVar29 = (uint)pPVar25;
                pPVar15 = p->pPars;
              }
              if (pPVar15->fSilent == 0) {
                Abc_Print(uVar29,"Quitting due to callback on fail in frame %d.\n",uVar22);
                pPVar15 = p->pPars;
              }
              pPVar15->iFrame = uVar21;
              return -1;
            }
          }
          if (pPVar15->nDropOuts + pPVar15->nFailOuts == p->pAig->nTruePos) {
            return -(uint)(pPVar15->nFailOuts == 0);
          }
          iVar7 = clock_gettime(3,(timespec *)&ts);
          if (iVar7 < 0) {
            lVar18 = -1;
          }
          else {
            lVar18 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          p->pPars->timeLastSolved = lVar18;
        }
      }
    }
    else {
      if (pVVar13->nSize <= iVar8) goto LAB_009125f3;
      if (pVVar13->pArray[uVar26] == (void *)0x0) goto LAB_009112d4;
    }
LAB_00911b7f:
    uVar29 = p->iOutCur + 1;
    uVar26 = (ulong)uVar29;
    p->iOutCur = uVar29;
    pAVar14 = p->pAig;
    iVar7 = pAVar14->nTruePos;
    if (iVar7 <= (int)uVar29) goto LAB_00911ba7;
    goto LAB_00911290;
  }
  goto LAB_00911baa;
LAB_00911ba7:
  uVar26 = 0;
LAB_00911baa:
  bVar28 = (byte)uVar26;
  if ((p->pPars->fUseAbs != 0) &&
     (pVVar10 = p->vAbsFlops, pVVar10 != (Vec_Int_t *)0x0 && bVar28 == 0)) {
    uVar29 = pVVar10->nSize;
    if (pVVar10->nCap < (int)uVar29) {
      if (pVVar10->pArray == (int *)0x0) {
        piVar11 = (int *)malloc((long)(int)uVar29 << 2);
      }
      else {
        piVar11 = (int *)realloc(pVVar10->pArray,(long)(int)uVar29 << 2);
      }
      pVVar10->pArray = piVar11;
      if (piVar11 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar10->nCap = uVar29;
    }
    if (0 < (int)uVar29) {
      memset(pVVar10->pArray,0,(ulong)uVar29 * 4);
    }
    pVVar10->nSize = uVar29;
    pVVar3 = p->vClauses;
    iVar7 = pVVar3->nSize;
    if (0 < iVar7) {
      lVar18 = 0;
      do {
        if (iVar7 <= lVar18) {
LAB_00912584:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecVec.h"
                        ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
        }
        pvVar4 = pVVar3->pArray[lVar18];
        if (0 < *(int *)((long)pvVar4 + 4)) {
          lVar19 = *(long *)((long)pvVar4 + 8);
          lVar23 = 0;
          do {
            lVar5 = *(long *)(lVar19 + lVar23 * 8);
            if (0 < *(int *)(lVar5 + 0x10)) {
              pVVar10 = p->vAbsFlops;
              lVar27 = 0;
              do {
                uVar29 = *(uint *)(lVar5 + 0x14 + lVar27 * 4);
                if ((int)uVar29 < 0) {
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                ,0x12f,"int Abc_Lit2Var(int)");
                }
                uVar29 = uVar29 >> 1;
                if (pVVar10->nSize <= (int)uVar29) goto LAB_009121d3;
                pVVar10->pArray[uVar29] = 1;
                lVar27 = lVar27 + 1;
              } while (lVar27 < *(int *)(lVar5 + 0x10));
              iVar7 = pVVar3->nSize;
            }
            if (iVar7 <= lVar18) goto LAB_00912584;
            lVar23 = lVar23 + 1;
          } while (lVar23 < *(int *)((long)pvVar4 + 4));
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 < iVar7);
    }
  }
  if (p->pPars->fVerbose != 0) {
    iVar7 = clock_gettime(3,(timespec *)&ts);
    if (iVar7 < 0) {
      lVar18 = -1;
    }
    else {
      lVar18 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    Pdr_ManPrintProgress(p,(uint)(bVar28 ^ 1),lVar18 - lVar17);
  }
  if (bVar28 == 0) goto LAB_00911e0e;
  goto LAB_00911121;
LAB_00911e0e:
  p->nQueLim = p->pPars->nRestLimit;
  if (pCube != (Pdr_Set_t *)0x0) {
    __assert_fail("pCube == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                  ,0x2a8,"int IPdr_ManSolveInt(Pdr_Man_t *, int, int)");
  }
  Pdr_ManSetPropertyOutput(p,uVar21);
  uVar21 = uVar21 + 1;
  uVar22 = (ulong)uVar21;
  Pdr_ManCreateSolver(p,uVar21);
  pPVar25 = p;
  iVar9 = Pdr_ManPushClauses(p);
  iVar7 = (int)pPVar25;
  pPVar15 = p->pPars;
  iVar8 = pPVar15->fVerbose;
  if (iVar9 == 0) {
    if (iVar8 != 0) {
      iVar7 = clock_gettime(3,(timespec *)&ts);
      if (iVar7 < 0) {
        lVar18 = -1;
      }
      else {
        lVar18 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
      }
      pPVar25 = p;
      Pdr_ManPrintProgress(p,0,lVar18 - lVar17);
      iVar7 = (int)pPVar25;
      pPVar15 = p->pPars;
    }
    if (pPVar15->pFuncStop != (_func_int_int *)0x0) {
      iVar7 = pPVar15->RunId;
      iVar8 = (*pPVar15->pFuncStop)(iVar7);
      if (iVar8 != 0) goto LAB_0091206d;
    }
    if (p->timeToStop == 0) {
      pPVar15 = p->pPars;
    }
    else {
      iVar7 = 3;
      iVar8 = clock_gettime(3,(timespec *)&ts);
      if (iVar8 < 0) {
        lVar18 = -1;
      }
      else {
        lVar18 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
      }
      pPVar15 = p->pPars;
      if (p->timeToStop < lVar18) {
        if (pPVar15->fVerbose != 0) {
          iVar7 = clock_gettime(3,(timespec *)&ts);
          if (iVar7 < 0) {
            lVar18 = -1;
          }
          else {
            lVar18 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          pPVar25 = p;
          Pdr_ManPrintProgress(p,1,lVar18 - lVar17);
          iVar7 = (int)pPVar25;
          pPVar15 = p->pPars;
        }
        if (pPVar15->fSilent != 0) goto LAB_00912070;
        uVar21 = pPVar15->nTimeOut;
        goto LAB_009125b9;
      }
    }
    if ((pPVar15->nTimeOutGap != 0) && (pPVar15->timeLastSolved != 0)) {
      iVar7 = 3;
      iVar8 = clock_gettime(3,(timespec *)&ts);
      if (iVar8 < 0) {
        lVar18 = -1;
      }
      else {
        lVar18 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
      }
      pPVar15 = p->pPars;
      if ((long)pPVar15->nTimeOutGap * 1000000 + pPVar15->timeLastSolved < lVar18) {
LAB_00911ff6:
        uVar21 = (uint)uVar22;
        if (pPVar15->fVerbose != 0) {
          iVar7 = clock_gettime(3,(timespec *)&ts);
          if (iVar7 < 0) {
            lVar18 = -1;
          }
          else {
            lVar18 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          pPVar25 = p;
          Pdr_ManPrintProgress(p,1,lVar18 - lVar17);
          iVar7 = (int)pPVar25;
          pPVar15 = p->pPars;
        }
        if (pPVar15->fSilent != 0) goto LAB_00912070;
        uVar20 = (ulong)(uint)pPVar15->nTimeOutGap;
        pcVar24 = "Reached gap timeout (%d seconds) in frame %d.\n";
        goto LAB_00912064;
      }
    }
    if ((pPVar15->nFrameMax != 0) && (pPVar15->nFrameMax <= (int)uVar21)) {
      if (pPVar15->fVerbose != 0) {
        iVar7 = clock_gettime(3,(timespec *)&ts);
        if (iVar7 < 0) {
          lVar18 = -1;
        }
        else {
          lVar18 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
        }
        pPVar25 = p;
        Pdr_ManPrintProgress(p,1,lVar18 - lVar17);
        iVar7 = (int)pPVar25;
        pPVar15 = p->pPars;
      }
      if (pPVar15->fSilent == 0) {
        uVar22 = (ulong)(uint)pPVar15->nFrameMax;
        pcVar24 = "Reached limit on the number of timeframes (%d).\n";
LAB_0091212c:
        Abc_Print(iVar7,pcVar24,uVar22);
LAB_0091206d:
        pPVar15 = p->pPars;
      }
LAB_00912070:
      pPVar15->iFrame = uVar21;
      return -1;
    }
    goto LAB_00911112;
  }
  if (iVar9 != -1) {
    if (iVar8 != 0) {
      iVar7 = clock_gettime(3,(timespec *)&ts);
      if (iVar7 < 0) {
        lVar18 = -1;
      }
      else {
        lVar18 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
      }
      Pdr_ManPrintProgress(p,1,lVar18 - lVar17);
      pPVar15 = p->pPars;
    }
    if (pPVar15->fSilent == 0) {
      Pdr_ManReportInvariant(p);
      pPVar15 = p->pPars;
      if (pPVar15->fSilent == 0) {
        Pdr_ManVerifyInvariant(p);
        pPVar15 = p->pPars;
      }
    }
    pPVar15->iFrame = uVar21;
    pAVar14 = p->pAig;
    iVar7 = pAVar14->nTruePos;
    iVar8 = iVar7 - (pPVar15->nFailOuts + pPVar15->nDropOuts);
    pPVar15->nProveOuts = iVar8;
    if (0 < iVar7 && pPVar15->vOutMap != (Vec_Int_t *)0x0) {
      lVar17 = 0;
      do {
        pPVar15 = p->pPars;
        pVVar10 = pPVar15->vOutMap;
        if (pVVar10->nSize <= lVar17) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar11 = pVVar10->pArray;
        if ((piVar11[lVar17] == -2) && (piVar11[lVar17] = 1, pPVar15->fUseBridge != 0)) {
          Gia_ManToBridgeResult(_stdout,1,(Abc_Cex_t *)0x0,(int)lVar17);
          pAVar14 = p->pAig;
        }
        lVar17 = lVar17 + 1;
        iVar7 = pAVar14->nTruePos;
      } while (lVar17 < iVar7);
      pPVar15 = p->pPars;
      iVar8 = pPVar15->nProveOuts;
    }
    if (iVar8 != iVar7) {
      return -(uint)(pPVar15->nFailOuts < 1);
    }
    return 1;
  }
  if (iVar8 != 0) {
    iVar7 = clock_gettime(3,(timespec *)&ts);
    if (iVar7 < 0) {
      lVar18 = -1;
    }
    else {
      lVar18 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    pPVar25 = p;
    Pdr_ManPrintProgress(p,1,lVar18 - lVar17);
    iVar7 = (int)pPVar25;
    pPVar15 = p->pPars;
  }
  if (pPVar15->fSilent != 0) goto LAB_0091206d;
  if (p->timeToStop != 0) {
    iVar7 = 3;
    iVar8 = clock_gettime(3,(timespec *)&ts);
    if (iVar8 < 0) {
      lVar17 = -1;
    }
    else {
      lVar17 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    pPVar15 = p->pPars;
    if (p->timeToStop < lVar17) {
LAB_009125b6:
      uVar21 = pPVar15->nTimeOut;
LAB_009125b9:
      uVar20 = (ulong)uVar21;
      pcVar24 = "Reached timeout (%d seconds) in frame %d.\n";
      goto LAB_00912064;
    }
  }
  uVar20 = (ulong)(uint)pPVar15->nConfLimit;
  pcVar24 = "Reached conflict limit (%d) in frame.\n";
LAB_00912064:
  uVar21 = (uint)uVar22;
  Abc_Print(iVar7,pcVar24,uVar20,uVar22);
  goto LAB_0091206d;
}

Assistant:

int IPdr_ManSolveInt( Pdr_Man_t * p, int fCheckClauses, int fPushClauses )
{
    int fPrintClauses = 0;
    Pdr_Set_t * pCube = NULL;
    Aig_Obj_t * pObj;
    Abc_Cex_t * pCexNew;
    int iFrame, RetValue = -1;
    int nOutDigits = Abc_Base10Log( Saig_ManPoNum(p->pAig) );
    abctime clkStart = Abc_Clock(), clkOne = 0;
    p->timeToStop = p->pPars->nTimeOut ? p->pPars->nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0;
    // assert( Vec_PtrSize(p->vSolvers) == 0 );
    // in the multi-output mode, mark trivial POs (those fed by const0) as solved 
    if ( p->pPars->fSolveAll )
        Saig_ManForEachPo( p->pAig, pObj, iFrame )
            if ( Aig_ObjChild0(pObj) == Aig_ManConst0(p->pAig) )
            {
                Vec_IntWriteEntry( p->pPars->vOutMap, iFrame, 1 ); // unsat
                p->pPars->nProveOuts++;
                if ( p->pPars->fUseBridge )
                    Gia_ManToBridgeResult( stdout, 1, NULL, iFrame );
            }
    // create the first timeframe
    p->pPars->timeLastSolved = Abc_Clock();

    if ( Vec_VecSize(p->vClauses) == 0 )
        Pdr_ManCreateSolver( p, (iFrame = 0) );
    else {
        iFrame = Vec_VecSize(p->vClauses) - 1;

        if ( fCheckClauses )
        {
            if ( p->pPars->fVerbose )
               Abc_Print( 1, "IPDR: Checking the reloaded length-%d trace...", iFrame + 1 ) ;
            IPdr_ManCheckClauses( p );
            if ( p->pPars->fVerbose )
               Abc_Print( 1, " Passed!\n" ) ;
        }

        if ( fPushClauses )
        {
            p->iUseFrame = Abc_MaxInt(iFrame, 1);

            if ( p->pPars->fVerbose ) 
            {
                Abc_Print( 1, "IPDR: Pushing the reloaded clauses. Before:\n" );
                Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
            }

            RetValue = Pdr_ManPushClauses( p );

            if ( p->pPars->fVerbose ) 
            {
                Abc_Print( 1, "IPDR: Finished pushing. After:\n" );
                Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
            }

            if ( RetValue ) 
            {
                Pdr_ManReportInvariant( p );
                Pdr_ManVerifyInvariant( p );
                return 1;
            }
        }

        if ( p->pPars->fUseAbs && p->vAbsFlops == NULL && iFrame >= 1 )
        {
            assert( p->vAbsFlops == NULL );
            p->vAbsFlops  = Vec_IntStart( Saig_ManRegNum(p->pAig) );
            p->vMapFf2Ppi = Vec_IntStartFull( Saig_ManRegNum(p->pAig) );
            p->vMapPpi2Ff = Vec_IntAlloc( 100 );
            
            IPdr_ManRestoreAbsFlops( p );
        }
 
    }
    while ( 1 )
    {
        int fRefined = 0;
        if ( p->pPars->fUseAbs && p->vAbsFlops == NULL && iFrame == 1 )
        {
//            int i, Prio;
            assert( p->vAbsFlops == NULL );
            p->vAbsFlops  = Vec_IntStart( Saig_ManRegNum(p->pAig) );
            p->vMapFf2Ppi = Vec_IntStartFull( Saig_ManRegNum(p->pAig) );
            p->vMapPpi2Ff = Vec_IntAlloc( 100 );
//            Vec_IntForEachEntry( p->vPrio, Prio, i )
//                if ( Prio >> p->nPrioShift  )
//                    Vec_IntWriteEntry( p->vAbsFlops, i, 1 );
        }
        //if ( p->pPars->fUseAbs && p->vAbsFlops )
        //    printf( "Starting frame %d with %d (%d) flops.\n", iFrame, Vec_IntCountPositive(p->vAbsFlops), Vec_IntCountPositive(p->vPrio) );
        p->nFrames = iFrame;
        assert( iFrame == Vec_PtrSize(p->vSolvers)-1 );
        p->iUseFrame = Abc_MaxInt(iFrame, 1);
        Saig_ManForEachPo( p->pAig, pObj, p->iOutCur )
        {
            // skip disproved outputs
            if ( p->vCexes && Vec_PtrEntry(p->vCexes, p->iOutCur) )
                continue;
            // skip output whose time has run out
            if ( p->pTime4Outs && p->pTime4Outs[p->iOutCur] == 0 )
                continue;
            // check if the output is trivially solved
            if ( Aig_ObjChild0(pObj) == Aig_ManConst0(p->pAig) )
                continue;
            // check if the output is trivially solved
            if ( Aig_ObjChild0(pObj) == Aig_ManConst1(p->pAig) )
            {
                if ( !p->pPars->fSolveAll )
                {
                    pCexNew = Abc_CexMakeTriv( Aig_ManRegNum(p->pAig), Saig_ManPiNum(p->pAig), Saig_ManPoNum(p->pAig), iFrame*Saig_ManPoNum(p->pAig)+p->iOutCur );
                    p->pAig->pSeqModel = pCexNew;
                    return 0; // SAT
                }
                pCexNew = (p->pPars->fUseBridge || p->pPars->fStoreCex) ? Abc_CexMakeTriv( Aig_ManRegNum(p->pAig), Saig_ManPiNum(p->pAig), Saig_ManPoNum(p->pAig), iFrame*Saig_ManPoNum(p->pAig)+p->iOutCur ) : (Abc_Cex_t *)(ABC_PTRINT_T)1;
                p->pPars->nFailOuts++;
                if ( p->pPars->vOutMap ) Vec_IntWriteEntry( p->pPars->vOutMap, p->iOutCur, 0 );
                if ( !p->pPars->fNotVerbose )
                Abc_Print( 1, "Output %*d was trivially asserted in frame %2d (solved %*d out of %*d outputs).\n",
                    nOutDigits, p->iOutCur, iFrame, nOutDigits, p->pPars->nFailOuts, nOutDigits, Saig_ManPoNum(p->pAig) );
                assert( Vec_PtrEntry(p->vCexes, p->iOutCur) == NULL );
                if ( p->pPars->fUseBridge )
                    Gia_ManToBridgeResult( stdout, 0, pCexNew, pCexNew->iPo );
                Vec_PtrWriteEntry( p->vCexes, p->iOutCur, pCexNew );
                if ( p->pPars->pFuncOnFail && p->pPars->pFuncOnFail(p->iOutCur, p->pPars->fStoreCex ? (Abc_Cex_t *)Vec_PtrEntry(p->vCexes, p->iOutCur) : NULL) )
                {
                    if ( p->pPars->fVerbose )
                        Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
                    if ( !p->pPars->fSilent )
                        Abc_Print( 1, "Quitting due to callback on fail in frame %d.\n", iFrame );
                    p->pPars->iFrame = iFrame;
                    return -1;
                }
                if ( p->pPars->nFailOuts + p->pPars->nDropOuts == Saig_ManPoNum(p->pAig) )
                    return p->pPars->nFailOuts ? 0 : -1; // SAT or UNDEC
                p->pPars->timeLastSolved = Abc_Clock();
                continue;
            }
            // try to solve this output
            if ( p->pTime4Outs )
            {
                assert( p->pTime4Outs[p->iOutCur] > 0 );
                clkOne = Abc_Clock();
                p->timeToStopOne = p->pTime4Outs[p->iOutCur] + Abc_Clock();
            }
            while ( 1 )
            {
                if ( p->pPars->nTimeOutGap && p->pPars->timeLastSolved && Abc_Clock() > p->pPars->timeLastSolved + p->pPars->nTimeOutGap * CLOCKS_PER_SEC )
                {
                    if ( p->pPars->fVerbose )
                        Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
                    if ( !p->pPars->fSilent )
                        Abc_Print( 1, "Reached gap timeout (%d seconds) in frame %d.\n",  p->pPars->nTimeOutGap, iFrame );
                    p->pPars->iFrame = iFrame;
                    return -1;
                }
                RetValue = Pdr_ManCheckCube( p, iFrame, NULL, &pCube, p->pPars->nConfLimit, 0, 1 );
                if ( RetValue == 1 )
                    break;
                if ( RetValue == -1 )
                {
                    if ( p->pPars->fVerbose )
                        Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
                    if ( p->timeToStop && Abc_Clock() > p->timeToStop )
                        Abc_Print( 1, "Reached timeout (%d seconds) in frame %d.\n",  p->pPars->nTimeOut, iFrame );
                    else if ( p->pPars->nTimeOutGap && p->pPars->timeLastSolved && Abc_Clock() > p->pPars->timeLastSolved + p->pPars->nTimeOutGap * CLOCKS_PER_SEC )
                        Abc_Print( 1, "Reached gap timeout (%d seconds) in frame %d.\n",  p->pPars->nTimeOutGap, iFrame );
                    else if ( p->timeToStopOne && Abc_Clock() > p->timeToStopOne )
                    {
                        Pdr_QueueClean( p );
                        pCube = NULL;
                        break; // keep solving
                    }
                    else if ( p->pPars->nConfLimit )
                        Abc_Print( 1, "Reached conflict limit (%d) in frame %d.\n",  p->pPars->nConfLimit, iFrame );
                    else if ( p->pPars->fVerbose )
                        Abc_Print( 1, "Computation cancelled by the callback in frame %d.\n", iFrame );
                    p->pPars->iFrame = iFrame;
                    return -1;
                }
                if ( RetValue == 0 )
                {
                    RetValue = Pdr_ManBlockCube( p, pCube );
                    if ( RetValue == -1 )
                    {
                        if ( p->pPars->fVerbose )
                            Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
                        if ( p->timeToStop && Abc_Clock() > p->timeToStop )
                            Abc_Print( 1, "Reached timeout (%d seconds) in frame %d.\n",  p->pPars->nTimeOut, iFrame );
                        else if ( p->pPars->nTimeOutGap && p->pPars->timeLastSolved && Abc_Clock() > p->pPars->timeLastSolved + p->pPars->nTimeOutGap * CLOCKS_PER_SEC )
                            Abc_Print( 1, "Reached gap timeout (%d seconds) in frame %d.\n",  p->pPars->nTimeOutGap, iFrame );
                        else if ( p->timeToStopOne && Abc_Clock() > p->timeToStopOne )
                        {
                            Pdr_QueueClean( p );
                            pCube = NULL;
                            break; // keep solving
                        }
                        else if ( p->pPars->nConfLimit )
                            Abc_Print( 1, "Reached conflict limit (%d) in frame %d.\n",  p->pPars->nConfLimit, iFrame );
                        else if ( p->pPars->fVerbose )
                            Abc_Print( 1, "Computation cancelled by the callback in frame %d.\n", iFrame );
                        p->pPars->iFrame = iFrame;
                        return -1;
                    }
                    if ( RetValue == 0 )
                    {
                        if ( fPrintClauses )
                        {
                            Abc_Print( 1, "*** Clauses after frame %d:\n", iFrame );
                            Pdr_ManPrintClauses( p, 0 );
                        }
                        if ( p->pPars->fVerbose && !p->pPars->fUseAbs )
                            Pdr_ManPrintProgress( p, !p->pPars->fSolveAll, Abc_Clock() - clkStart );
                        p->pPars->iFrame = iFrame;
                        if ( !p->pPars->fSolveAll )
                        {
                            abctime clk = Abc_Clock();
                            Abc_Cex_t * pCex = Pdr_ManDeriveCexAbs(p);
                            p->tAbs += Abc_Clock() - clk;
                            if ( pCex == NULL )
                            {
                                assert( p->pPars->fUseAbs );
                                Pdr_QueueClean( p );
                                pCube = NULL;
                                fRefined = 1;
                                break; // keep solving
                            }
                            p->pAig->pSeqModel = pCex;

                            if ( p->pPars->fVerbose && p->pPars->fUseAbs )
                                Pdr_ManPrintProgress( p, !p->pPars->fSolveAll, Abc_Clock() - clkStart );
                            return 0; // SAT
                        }
                        p->pPars->nFailOuts++;
                        pCexNew = (p->pPars->fUseBridge || p->pPars->fStoreCex) ? Pdr_ManDeriveCex(p) : (Abc_Cex_t *)(ABC_PTRINT_T)1;
                        if ( p->pPars->vOutMap ) Vec_IntWriteEntry( p->pPars->vOutMap, p->iOutCur, 0 );
                        assert( Vec_PtrEntry(p->vCexes, p->iOutCur) == NULL );
                        if ( p->pPars->fUseBridge )
                            Gia_ManToBridgeResult( stdout, 0, pCexNew, pCexNew->iPo );
                        Vec_PtrWriteEntry( p->vCexes, p->iOutCur, pCexNew );
                        if ( p->pPars->pFuncOnFail && p->pPars->pFuncOnFail(p->iOutCur, p->pPars->fStoreCex ? (Abc_Cex_t *)Vec_PtrEntry(p->vCexes, p->iOutCur) : NULL) )
                        {
                            if ( p->pPars->fVerbose )
                                Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
                            if ( !p->pPars->fSilent )
                                Abc_Print( 1, "Quitting due to callback on fail in frame %d.\n", iFrame );
                            p->pPars->iFrame = iFrame;
                            return -1;
                        }
                        if ( !p->pPars->fNotVerbose )
                            Abc_Print( 1, "Output %*d was asserted in frame %2d (%2d) (solved %*d out of %*d outputs).\n",
                                nOutDigits, p->iOutCur, iFrame, iFrame, nOutDigits, p->pPars->nFailOuts, nOutDigits, Saig_ManPoNum(p->pAig) );
                        if ( p->pPars->nFailOuts == Saig_ManPoNum(p->pAig) )
                            return 0; // all SAT
                        Pdr_QueueClean( p );
                        pCube = NULL;
                        break; // keep solving
                    }
                    if ( p->pPars->fVerbose )
                        Pdr_ManPrintProgress( p, 0, Abc_Clock() - clkStart );
                }
            }
            if ( fRefined )
                break;
            if ( p->pTime4Outs )
            {
                abctime timeSince = Abc_Clock() - clkOne;
                assert( p->pTime4Outs[p->iOutCur] > 0 );
                p->pTime4Outs[p->iOutCur] = (p->pTime4Outs[p->iOutCur] > timeSince) ? p->pTime4Outs[p->iOutCur] - timeSince : 0;
                if ( p->pTime4Outs[p->iOutCur] == 0 && Vec_PtrEntry(p->vCexes, p->iOutCur) == NULL ) // undecided
                {
                    p->pPars->nDropOuts++;
                    if ( p->pPars->vOutMap ) 
                        Vec_IntWriteEntry( p->pPars->vOutMap, p->iOutCur, -1 );
                    if ( !p->pPars->fNotVerbose ) 
                        Abc_Print( 1, "Timing out on output %*d in frame %d.\n", nOutDigits, p->iOutCur, iFrame );
                }
                p->timeToStopOne = 0;
            }
        }
        /*
        if ( p->pPars->fUseAbs && p->vAbsFlops && !fRefined )
        {
            int i, Used;
            Vec_IntForEachEntry( p->vAbsFlops, Used, i )
                if ( Used && (Vec_IntEntry(p->vPrio, i) >> p->nPrioShift) == 0 )
                    Vec_IntWriteEntry( p->vAbsFlops, i, 0 );
        }
        */
        if ( p->pPars->fUseAbs && p->vAbsFlops && !fRefined )
        {
            Pdr_Set_t * pSet;
            int i, j, k;
            Vec_IntFill( p->vAbsFlops, Vec_IntSize( p->vAbsFlops ), 0 );
            Vec_VecForEachEntry( Pdr_Set_t *, p->vClauses, pSet, i, j )
                for ( k = 0; k < pSet->nLits; k++ )
                    Vec_IntWriteEntry( p->vAbsFlops, Abc_Lit2Var(pSet->Lits[k]), 1 );
        }

        if ( p->pPars->fVerbose )
            Pdr_ManPrintProgress( p, !fRefined, Abc_Clock() - clkStart );
        if ( fRefined )
            continue;
        //if ( p->pPars->fUseAbs && p->vAbsFlops )
        //    printf( "Finished frame %d with %d (%d) flops.\n", iFrame, Vec_IntCountPositive(p->vAbsFlops), Vec_IntCountPositive(p->vPrio) );
        // open a new timeframe
        p->nQueLim = p->pPars->nRestLimit;
        assert( pCube == NULL );
        Pdr_ManSetPropertyOutput( p, iFrame );
        Pdr_ManCreateSolver( p, ++iFrame );
        if ( fPrintClauses )
        {
            Abc_Print( 1, "*** Clauses after frame %d:\n", iFrame );
            Pdr_ManPrintClauses( p, 0 );
        }
        // push clauses into this timeframe
        RetValue = Pdr_ManPushClauses( p );
        if ( RetValue == -1 )
        {
            if ( p->pPars->fVerbose )
                Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
            if ( !p->pPars->fSilent )
            {
                if ( p->timeToStop && Abc_Clock() > p->timeToStop )
                    Abc_Print( 1, "Reached timeout (%d seconds) in frame %d.\n",  p->pPars->nTimeOut, iFrame );
                else
                    Abc_Print( 1, "Reached conflict limit (%d) in frame.\n",  p->pPars->nConfLimit, iFrame );
            }
            p->pPars->iFrame = iFrame;
            return -1;
        }
        if ( RetValue )
        {
            if ( p->pPars->fVerbose )
                Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
            if ( !p->pPars->fSilent )
                Pdr_ManReportInvariant( p );
            if ( !p->pPars->fSilent )
                Pdr_ManVerifyInvariant( p );
            p->pPars->iFrame = iFrame;
            // count the number of UNSAT outputs
            p->pPars->nProveOuts = Saig_ManPoNum(p->pAig) - p->pPars->nFailOuts - p->pPars->nDropOuts;
            // convert previously 'unknown' into 'unsat'
            if ( p->pPars->vOutMap )
                for ( iFrame = 0; iFrame < Saig_ManPoNum(p->pAig); iFrame++ )
                    if ( Vec_IntEntry(p->pPars->vOutMap, iFrame) == -2 ) // unknown
                    {
                        Vec_IntWriteEntry( p->pPars->vOutMap, iFrame, 1 ); // unsat
                        if ( p->pPars->fUseBridge )
                            Gia_ManToBridgeResult( stdout, 1, NULL, iFrame );
                    }
            if ( p->pPars->nProveOuts == Saig_ManPoNum(p->pAig) )
                return 1; // UNSAT
            if ( p->pPars->nFailOuts > 0 )
                return 0; // SAT
            return -1;
        }
        if ( p->pPars->fVerbose )
            Pdr_ManPrintProgress( p, 0, Abc_Clock() - clkStart );

        // check termination
        if ( p->pPars->pFuncStop && p->pPars->pFuncStop(p->pPars->RunId) )
        {
            p->pPars->iFrame = iFrame;
            return -1;
        }
        if ( p->timeToStop && Abc_Clock() > p->timeToStop )
        {
            if ( fPrintClauses )
            {
                Abc_Print( 1, "*** Clauses after frame %d:\n", iFrame );
                Pdr_ManPrintClauses( p, 0 );
            }
            if ( p->pPars->fVerbose )
                Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
            if ( !p->pPars->fSilent )
                Abc_Print( 1, "Reached timeout (%d seconds) in frame %d.\n",  p->pPars->nTimeOut, iFrame );
            p->pPars->iFrame = iFrame;
            return -1;
        }
        if ( p->pPars->nTimeOutGap && p->pPars->timeLastSolved && Abc_Clock() > p->pPars->timeLastSolved + p->pPars->nTimeOutGap * CLOCKS_PER_SEC )
        {
            if ( fPrintClauses )
            {
                Abc_Print( 1, "*** Clauses after frame %d:\n", iFrame );
                Pdr_ManPrintClauses( p, 0 );
            }
            if ( p->pPars->fVerbose )
                Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
            if ( !p->pPars->fSilent )
                Abc_Print( 1, "Reached gap timeout (%d seconds) in frame %d.\n",  p->pPars->nTimeOutGap, iFrame );
            p->pPars->iFrame = iFrame;
            return -1;
        }
        if ( p->pPars->nFrameMax && iFrame >= p->pPars->nFrameMax )
        {
            if ( p->pPars->fVerbose )
                Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
            if ( !p->pPars->fSilent )
                Abc_Print( 1, "Reached limit on the number of timeframes (%d).\n", p->pPars->nFrameMax );
            p->pPars->iFrame = iFrame;
            return -1;
        }
    }
    assert( 0 );
    return -1;
}